

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O1

bool WTF::ParseName(State *state)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  bool bVar10;
  int iVar11;
  short sVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  State copy;
  undefined4 local_2c;
  undefined4 uStack_28;
  
  pcVar3 = state->mangled_cur;
  pcVar5 = state->out_cur;
  pcVar6 = state->out_begin;
  pcVar7 = state->out_end;
  uVar8 = *(undefined8 *)((long)&state->prev_name + 4);
  uStack_28 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
  local_2c = (undefined4)((ulong)pcVar7 >> 0x20);
  sVar1 = state->nest_level;
  bVar15 = state->append;
  bVar10 = state->overflowed;
  if (*state->mangled_cur == 'N') {
    state->mangled_cur = state->mangled_cur + 1;
    state->nest_level = 0;
    ParseCVQualifiers(state);
    ParsePrefix(state);
    state->nest_level = sVar1;
    if (*state->mangled_cur == 'E') {
      state->mangled_cur = state->mangled_cur + 1;
      return true;
    }
  }
  *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_28,local_2c);
  *(undefined8 *)((long)&state->prev_name + 4) = uVar8;
  state->out_begin = pcVar6;
  state->out_end = pcVar7;
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar5;
  state->nest_level = sVar1;
  state->append = bVar15;
  state->overflowed = bVar10;
  pcVar5 = state->mangled_cur;
  pcVar6 = state->out_cur;
  pcVar7 = state->out_begin;
  pcVar9 = state->out_end;
  pcVar3 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar1 = state->nest_level;
  bVar15 = state->append;
  bVar10 = state->overflowed;
  iVar11 = state->prev_name_length;
  sVar12 = state->nest_level;
  bVar16 = state->append;
  bVar13 = state->overflowed;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar14 = ParseEncoding(state);
    if ((bVar14) && (*state->mangled_cur == 'E')) {
      state->mangled_cur = state->mangled_cur + 1;
      MaybeAppend(state,"::");
      bVar14 = ParseName(state);
      if (bVar14) goto LAB_001076eb;
    }
  }
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  state->prev_name = pcVar3;
  state->prev_name_length = iVar2;
  state->nest_level = sVar1;
  state->append = bVar15;
  state->overflowed = bVar10;
  state->out_begin = pcVar7;
  state->out_end = pcVar9;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar15 = ParseEncoding(state);
    if (((bVar15) && (pcVar4 = state->mangled_cur, *pcVar4 == 'E')) && (pcVar4[1] == 's')) {
      state->mangled_cur = pcVar4 + 2;
LAB_001076eb:
      ParseDiscriminator(state);
      return true;
    }
  }
  state->prev_name = pcVar3;
  state->prev_name_length = iVar11;
  state->nest_level = sVar12;
  state->append = bVar16;
  state->overflowed = bVar13;
  state->out_begin = pcVar7;
  state->out_end = pcVar9;
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  pcVar5 = state->mangled_cur;
  pcVar6 = state->out_cur;
  pcVar7 = state->out_begin;
  pcVar9 = state->out_end;
  pcVar3 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar1 = state->nest_level;
  bVar15 = state->append;
  bVar10 = state->overflowed;
  bVar16 = ParseUnscopedName(state);
  if (((bVar16) || (bVar16 = ParseSubstitution(state), bVar16)) &&
     (bVar16 = ParseTemplateArgs(state), bVar16)) {
    return true;
  }
  state->prev_name = pcVar3;
  state->prev_name_length = iVar2;
  state->nest_level = sVar1;
  state->append = bVar15;
  state->overflowed = bVar10;
  state->out_begin = pcVar7;
  state->out_end = pcVar9;
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  bVar15 = ParseUnscopedName(state);
  return bVar15;
}

Assistant:

static bool ParseName(State *state) {
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseUnscopedTemplateName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <unscoped-template-name> <template-args>.
  if (ParseUnscopedName(state)) {
    return true;
  }
  return false;
}